

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

Node<QFont::Tag,_unsigned_int> * __thiscall
QHashPrivate::Span<QHashPrivate::Node<QFont::Tag,_unsigned_int>_>::insert
          (Span<QHashPrivate::Node<QFont::Tag,_unsigned_int>_> *this,size_t i)

{
  byte bVar1;
  
  bVar1 = this->nextFree;
  if (bVar1 == this->allocated) {
    addStorage(this);
    bVar1 = this->nextFree;
  }
  this->nextFree = (this->entries->storage).data[(uint)bVar1 * 8];
  this->offsets[i] = bVar1;
  return (Node<QFont::Tag,_unsigned_int> *)((this->entries->storage).data + (uint)bVar1 * 8);
}

Assistant:

Node *insert(size_t i)
    {
        Q_ASSERT(i < SpanConstants::NEntries);
        Q_ASSERT(offsets[i] == SpanConstants::UnusedEntry);
        if (nextFree == allocated)
            addStorage();
        unsigned char entry = nextFree;
        Q_ASSERT(entry < allocated);
        nextFree = entries[entry].nextFree();
        offsets[i] = entry;
        return &entries[entry].node();
    }